

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void ghc::filesystem::detail::appendUTF8(string *str,uint32_t unicode)

{
  char cVar1;
  uint32_t unicode_local;
  string *str_local;
  
  cVar1 = (char)str;
  if (unicode < 0x80) {
    std::__cxx11::string::push_back(cVar1);
  }
  else if ((unicode < 0x80) || (0x7ff < unicode)) {
    if (((unicode < 0x800) || (0xd7ff < unicode)) && ((unicode < 0xe000 || (0xffff < unicode)))) {
      if ((unicode < 0x10000) || (0x10ffff < unicode)) {
        appendUTF8(str,0xfffd);
      }
      else {
        std::__cxx11::string::push_back(cVar1);
        std::__cxx11::string::push_back(cVar1);
        std::__cxx11::string::push_back(cVar1);
        std::__cxx11::string::push_back(cVar1);
      }
    }
    else {
      std::__cxx11::string::push_back(cVar1);
      std::__cxx11::string::push_back(cVar1);
      std::__cxx11::string::push_back(cVar1);
    }
  }
  else {
    std::__cxx11::string::push_back(cVar1);
    std::__cxx11::string::push_back(cVar1);
  }
  return;
}

Assistant:

GHC_INLINE void appendUTF8(std::string& str, uint32_t unicode)
{
    if (unicode <= 0x7f) {
        str.push_back(static_cast<char>(unicode));
    }
    else if (unicode >= 0x80 && unicode <= 0x7ff) {
        str.push_back(static_cast<char>((unicode >> 6) + 192));
        str.push_back(static_cast<char>((unicode & 0x3f) + 128));
    }
    else if ((unicode >= 0x800 && unicode <= 0xd7ff) || (unicode >= 0xe000 && unicode <= 0xffff)) {
        str.push_back(static_cast<char>((unicode >> 12) + 224));
        str.push_back(static_cast<char>(((unicode & 0xfff) >> 6) + 128));
        str.push_back(static_cast<char>((unicode & 0x3f) + 128));
    }
    else if (unicode >= 0x10000 && unicode <= 0x10ffff) {
        str.push_back(static_cast<char>((unicode >> 18) + 240));
        str.push_back(static_cast<char>(((unicode & 0x3ffff) >> 12) + 128));
        str.push_back(static_cast<char>(((unicode & 0xfff) >> 6) + 128));
        str.push_back(static_cast<char>((unicode & 0x3f) + 128));
    }
    else {
#ifdef GHC_RAISE_UNICODE_ERRORS
        throw filesystem_error("Illegal code point for unicode character.", str, std::make_error_code(std::errc::illegal_byte_sequence));
#else
        appendUTF8(str, 0xfffd);
#endif
    }
}